

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsBody.cpp
# Opt level: O2

void __thiscall chrono::ChShaftsBody::ArchiveIN(ChShaftsBody *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChShaftsBody>(marchive);
  ChPhysicsItem::ArchiveIN(&this->super_ChPhysicsItem,marchive);
  local_28._value = &this->shaft_dir;
  local_28._name = "shaft_dir";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

void ChShaftsBody::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChShaftsBody>();

    // deserialize parent class:
    ChPhysicsItem::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(shaft_dir);
    // marchive >> CHNVP(shaft);  //***TODO*** serialize, with shared ptr
    // marchive >> CHNVP(body); //***TODO*** serialize, with shared ptr
}